

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocking_queue_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::tools::
BlockingQueueTest_test_poll_will_block_until_second_thread_pushes_to_empty_queue_Test::TestBody
          (BlockingQueueTest_test_poll_will_block_until_second_thread_pushes_to_empty_queue_Test
           *this)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  char *message;
  char *in_R9;
  thread thread;
  AssertionResult gtest_ar;
  duration elapsed;
  duration<long,_std::ratio<1L,_1000L>_> local_110;
  AssertHelper local_108;
  thread local_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  duration<long,_std::ratio<1L,_1000L>_> local_d8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  BlockingQueue<int> local_c8;
  
  lVar2 = std::chrono::_V2::system_clock::now();
  memset(&local_c8,0,0xa8);
  std::condition_variable::condition_variable(&local_c8.condition_);
  local_c8.queue_.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_last = (_Elt_pointer)0x0;
  local_c8.queue_.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node = (_Map_pointer)0x0;
  local_c8.queue_.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_cur = (_Elt_pointer)0x0;
  local_c8.queue_.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_first = (_Elt_pointer)0x0;
  local_c8.queue_.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_last = (_Elt_pointer)0x0;
  local_c8.queue_.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_node = (_Map_pointer)0x0;
  local_c8.queue_.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_cur = (_Elt_pointer)0x0;
  local_c8.queue_.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_first = (_Elt_pointer)0x0;
  local_c8.queue_.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map
       = (_Map_pointer)0x0;
  local_c8.queue_.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            (&local_c8.queue_.super__Deque_base<int,_std::allocator<int>_>,0);
  local_110.__r._0_4_ = 1;
  local_d8.__r = 500;
  local_f8._0_8_ = &local_c8;
  std::thread::
  thread<void(&)(bidfx_public_api::tools::BlockingQueue<int>*,int,std::chrono::duration<long,std::ratio<1l,1000l>>),bidfx_public_api::tools::BlockingQueue<int>*,int,std::chrono::duration<long,std::ratio<1l,1000l>>,void>
            (&local_100,PushToIntBlockingQueueAfterSleep,(BlockingQueue<int> **)local_f8,
             (int *)&local_110,&local_d8);
  BlockingQueue<int>::Poll((iterator *)local_f8,&local_c8,(milliseconds)0x3e8);
  local_d8.__r._0_1_ = *(int *)local_f8._0_8_ == 1;
  local_d0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (*(int *)local_f8._0_8_ != 1) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_d8,
               (AssertionResult *)"*queue.Poll(std::chrono::milliseconds(1000)) == 1","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/blocking_queue_test.cpp"
               ,0x58,(char *)local_f8._0_8_);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if ((BlockingQueue<int> *)local_f8._0_8_ != (BlockingQueue<int> *)local_e8) {
      operator_delete((void *)local_f8._0_8_,local_e8._0_8_ + 1);
    }
    if ((long *)local_110.__r != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_110.__r != (long *)0x0)) {
        (**(code **)(*(long *)local_110.__r + 8))();
      }
      local_110.__r = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  lVar3 = std::chrono::_V2::system_clock::now();
  local_d8.__r = lVar3 - lVar2;
  local_110.__r = (rep)&DAT_00000258;
  testing::internal::
  CmpHelperLT<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000l>>>
            ((internal *)local_f8,"elapsed","std::chrono::milliseconds(600)",
             (duration<long,_std::ratio<1L,_1000000000L>_> *)&local_d8,&local_110);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if ((_Elt_pointer)local_f8._8_8_ == (_Elt_pointer)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/blocking_queue_test.cpp"
               ,0x5c,message);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if ((long *)local_110.__r != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_110.__r != (long *)0x0)) {
        (**(code **)(*(long *)local_110.__r + 8))();
      }
      local_110.__r = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_f8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::thread::join();
  if (local_100._M_id._M_thread == 0) {
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              (&local_c8.queue_.super__Deque_base<int,_std::allocator<int>_>);
    std::condition_variable::~condition_variable(&local_c8.condition_);
    return;
  }
  std::terminate();
}

Assistant:

TEST(BlockingQueueTest, test_poll_will_block_until_second_thread_pushes_to_empty_queue)
{
    std::chrono::high_resolution_clock::time_point start_time = std::chrono::high_resolution_clock::now();
    BlockingQueue<int> queue = BlockingQueue<int>();

    std::thread thread(PushToIntBlockingQueueAfterSleep, &queue, 1, std::chrono::milliseconds(500));
    EXPECT_TRUE(*queue.Poll(std::chrono::milliseconds(1000)) == 1);

    std::chrono::high_resolution_clock::time_point time_now = std::chrono::high_resolution_clock::now();
    std::chrono::high_resolution_clock::duration elapsed = time_now - start_time;
    EXPECT_LT(elapsed, std::chrono::milliseconds(600));

    thread.join();
}